

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCUtil.cpp
# Opt level: O1

void Assimp::IFC::ConvertAxisPlacement(IfcMatrix4 *out,IfcAxis2Placement3D *in)

{
  IfcCartesianPoint *in_00;
  IfcDirection *pIVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  IfcVector3 loc;
  IfcVector3 local_80;
  IfcVector3 local_68;
  double local_50;
  double local_48;
  double local_40;
  IfcVector3 local_38;
  
  local_38.x = 0.0;
  local_38.y = 0.0;
  local_38.z = 0.0;
  in_00 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcCartesianPoint>
                    (*(LazyObject **)
                      &(in->super_IfcPlacement).super_IfcGeometricRepresentationItem.field_0x30);
  ConvertCartesianPoint(&local_38,in_00);
  local_68.x = 0.0;
  local_68.y = 0.0;
  local_68.z = 1.0;
  local_80.x = 1.0;
  local_80.y = 0.0;
  local_80.z = 0.0;
  if (in->field_0x50 == '\x01') {
    pIVar1 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcDirection>
                       (*(LazyObject **)&(in->super_IfcPlacement).field_0x48);
    ConvertDirection(&local_68,pIVar1);
  }
  if ((in->RefDirection).have == true) {
    pIVar1 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcDirection>((in->RefDirection).ptr.obj)
    ;
    ConvertDirection(&local_80,pIVar1);
  }
  dVar5 = local_80.z;
  dVar4 = local_80.y;
  dVar3 = local_80.x;
  dVar2 = local_80.z * local_80.z + local_80.x * local_80.x + local_80.y * local_80.y;
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  dVar2 = 1.0 / dVar2;
  local_80.x = dVar3 * dVar2;
  local_80.y = dVar4 * dVar2;
  local_80.z = dVar5 * dVar2;
  dVar2 = local_80.z * local_68.z + local_80.x * local_68.x + local_80.y * local_68.y;
  dVar4 = local_80.x - local_68.x * dVar2;
  dVar5 = local_80.y - local_68.y * dVar2;
  dVar3 = local_80.z - dVar2 * local_68.z;
  dVar2 = dVar3 * dVar3 + dVar4 * dVar4 + dVar5 * dVar5;
  if (dVar2 < 0.0) {
    local_40 = local_68.x;
    local_48 = local_68.y;
    local_50 = local_68.z;
    dVar2 = sqrt(dVar2);
    local_68.x = local_40;
    local_68.y = local_48;
    local_68.z = local_50;
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  dVar2 = 1.0 / dVar2;
  dVar4 = dVar4 * dVar2;
  dVar5 = dVar5 * dVar2;
  dVar2 = dVar2 * dVar3;
  out->a1 = 1.0;
  out->a2 = 0.0;
  out->a3 = 0.0;
  out->a4 = 0.0;
  out->b1 = 0.0;
  out->b2 = 1.0;
  out->b3 = 0.0;
  out->b4 = 0.0;
  out->c1 = 0.0;
  out->c2 = 0.0;
  out->c3 = 1.0;
  out->c4 = 0.0;
  out->d1 = 0.0;
  out->d2 = 0.0;
  out->d3 = 0.0;
  out->d4 = 1.0;
  out->a4 = local_38.x;
  out->b4 = local_38.y;
  out->c4 = local_38.z;
  out->a1 = dVar4;
  out->b1 = dVar5;
  out->c1 = dVar2;
  out->a2 = local_68.y * dVar2 - dVar5 * local_68.z;
  out->b2 = local_68.z * dVar4 - dVar2 * local_68.x;
  out->c2 = local_68.x * dVar5 - dVar4 * local_68.y;
  out->a3 = local_68.x;
  out->b3 = local_68.y;
  out->c3 = local_68.z;
  return;
}

Assistant:

void ConvertAxisPlacement(IfcMatrix4& out, const Schema_2x3::IfcAxis2Placement3D& in)
{
    IfcVector3 loc;
    ConvertCartesianPoint(loc,in.Location);

    IfcVector3 z(0.f,0.f,1.f),r(1.f,0.f,0.f),x;

    if (in.Axis) {
        ConvertDirection(z,*in.Axis.Get());
    }
    if (in.RefDirection) {
        ConvertDirection(r,*in.RefDirection.Get());
    }

    IfcVector3 v = r.Normalize();
    IfcVector3 tmpx = z * (v*z);

    x = (v-tmpx).Normalize();
    IfcVector3 y = (z^x);

    IfcMatrix4::Translation(loc,out);
    AssignMatrixAxes(out,x,y,z);
}